

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int emit_server_name_extension(ptls_buffer_t *buf,char *server_name)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  ulong in_RAX;
  size_t len;
  long lVar4;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  iVar3 = ptls_buffer__do_pushv(buf,"",2);
  if (iVar3 == 0) {
    sVar1 = buf->off;
    uStack_28 = uStack_28 & 0xffffffffffffff;
    iVar3 = ptls_buffer__do_pushv(buf,(void *)((long)&uStack_28 + 7),1);
    if (iVar3 == 0) {
      iVar3 = ptls_buffer__do_pushv(buf,"",2);
      if (iVar3 == 0) {
        sVar2 = buf->off;
        len = strlen(server_name);
        iVar3 = ptls_buffer__do_pushv(buf,server_name,len);
        if (iVar3 == 0) {
          lVar4 = buf->off - sVar2;
          buf->base[sVar2 - 2] = (uint8_t)((ulong)lVar4 >> 8);
          buf->base[sVar2 - 1] = (uint8_t)lVar4;
          lVar4 = buf->off - sVar1;
          buf->base[sVar1 - 2] = (uint8_t)((ulong)lVar4 >> 8);
          buf->base[sVar1 - 1] = (uint8_t)lVar4;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int emit_server_name_extension(ptls_buffer_t *buf, const char *server_name)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, PTLS_SERVER_NAME_TYPE_HOSTNAME);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, server_name, strlen(server_name)); });
    });

    ret = 0;
Exit:
    return ret;
}